

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O3

void __thiscall
iu_Expression_x_iutest_x_Logical_Test::Body(iu_Expression_x_iutest_x_Logical_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *in_R9;
  AssertionResult iutest_ar;
  bool local_269;
  ExpressionResult local_268;
  AssertionHelper local_240;
  int local_210 [2];
  long *local_208 [2];
  long local_1f8 [2];
  char local_1e8;
  ExpressionLHS<int> local_1e0;
  undefined1 local_1b8 [32];
  bool local_198;
  ios_base local_138 [264];
  
  local_210[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_1e0,local_210 + 1);
  local_210[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==(&local_268,&local_1e0,local_210);
  local_269 = true;
  iutest::detail::ExpressionResult::operator&&((ExpressionResult *)&local_240,&local_268,&local_269)
  ;
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_240,true);
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,local_1b8._0_8_,(pointer)(local_1b8._0_8_ + local_1b8._8_8_));
  local_1e8 = local_198;
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  paVar1 = &local_240.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_240.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  paVar2 = &local_268.m_result.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.m_result.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.m_result.m_message._M_dataplus._M_p,
                    local_268.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_1e0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_268,(internal *)local_208,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() == 42 && g() == false))","false","true",
               in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,local_268.m_result.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1e0);
    local_240.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_240.m_part_result.super_iuCodeMessage.m_line = 0x4e;
    local_240.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_240,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_240.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.m_result.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_268.m_result.m_message._M_dataplus._M_p,
                      local_268.m_result.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  local_210[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_1e0,local_210 + 1);
  local_210[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=(&local_268,&local_1e0,local_210);
  local_269 = true;
  iutest::detail::ExpressionResult::operator||((ExpressionResult *)&local_240,&local_268,&local_269)
  ;
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_240,true);
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,local_1b8._0_8_,(pointer)(local_1b8._0_8_ + local_1b8._8_8_));
  local_1e8 = local_198;
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_240.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.m_result.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.m_result.m_message._M_dataplus._M_p,
                    local_268.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_268,(internal *)local_208,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42 || g() == false))","false","true",
               in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,local_268.m_result.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1e0);
    local_240.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_240.m_part_result.super_iuCodeMessage.m_line = 0x4f;
    local_240.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_240,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_240.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.m_result.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_268.m_result.m_message._M_dataplus._M_p,
                      local_268.m_result.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  return;
}

Assistant:

IUTEST(Expression, Logical)
{
    IUTEST_EXPECT(f() == 42 && g() == false );
    IUTEST_EXPECT(f() != 42 || g() == false );
}